

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void google::protobuf::internal::RepeatedPrimitiveGenericTypeTraits::InitializeDefaultRepeatedFields
               (void)

{
  RepeatedField<int> *this;
  RepeatedField<long> *this_00;
  RepeatedField<unsigned_int> *this_01;
  RepeatedField<unsigned_long> *this_02;
  RepeatedField<double> *this_03;
  RepeatedField<float> *this_04;
  RepeatedField<bool> *this_05;
  
  this = (RepeatedField<int> *)operator_new(0x10);
  RepeatedField<int>::RepeatedField(this);
  default_repeated_field_int32_ = this;
  this_00 = (RepeatedField<long> *)operator_new(0x10);
  RepeatedField<long>::RepeatedField(this_00);
  default_repeated_field_int64_ = this_00;
  this_01 = (RepeatedField<unsigned_int> *)operator_new(0x10);
  RepeatedField<unsigned_int>::RepeatedField(this_01);
  default_repeated_field_uint32_ = this_01;
  this_02 = (RepeatedField<unsigned_long> *)operator_new(0x10);
  RepeatedField<unsigned_long>::RepeatedField(this_02);
  default_repeated_field_uint64_ = this_02;
  this_03 = (RepeatedField<double> *)operator_new(0x10);
  RepeatedField<double>::RepeatedField(this_03);
  default_repeated_field_double_ = this_03;
  this_04 = (RepeatedField<float> *)operator_new(0x10);
  RepeatedField<float>::RepeatedField(this_04);
  default_repeated_field_float_ = this_04;
  this_05 = (RepeatedField<bool> *)operator_new(0x10);
  RepeatedField<bool>::RepeatedField(this_05);
  default_repeated_field_bool_ = this_05;
  OnShutdown(DestroyDefaultRepeatedFields);
  return;
}

Assistant:

void RepeatedPrimitiveGenericTypeTraits::InitializeDefaultRepeatedFields() {
  default_repeated_field_int32_ = new RepeatedField<int32>;
  default_repeated_field_int64_ = new RepeatedField<int64>;
  default_repeated_field_uint32_ = new RepeatedField<uint32>;
  default_repeated_field_uint64_ = new RepeatedField<uint64>;
  default_repeated_field_double_ = new RepeatedField<double>;
  default_repeated_field_float_ = new RepeatedField<float>;
  default_repeated_field_bool_ = new RepeatedField<bool>;
  OnShutdown(&DestroyDefaultRepeatedFields);
}